

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

response * __thiscall
CppWebSpider::requests::post
          (response *__return_storage_ptr__,requests *this,string *host,string *uri,uint16_t port,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,string json_data,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          data,CookieJar *cookie,int timeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint __val;
  __hashtable *p_Var4;
  uint uVar5;
  int sockfd;
  long *plVar6;
  long *plVar7;
  uint uVar8;
  size_type *psVar9;
  ulong uVar10;
  requests *this_00;
  _Alloc_hider _Var11;
  EVP_PKEY_CTX *this_01;
  undefined6 in_register_00000082;
  uint __len;
  int iVar12;
  bool bVar13;
  string __str;
  string sendmsg;
  _Alloc_hider local_220;
  char local_210 [16];
  __hashtable *__h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string post_data;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar3 = (host->_M_dataplus)._M_p;
  this_01 = (EVP_PKEY_CTX *)local_50;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + host->_M_string_length,uri,
             CONCAT62(in_register_00000082,port));
  sockfd = init((requests *)this_01,(EVP_PKEY_CTX *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (sockfd < 0) {
    pcVar3 = (host->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + host->_M_string_length);
    pcVar3 = (uri->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + uri->_M_string_length);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    response::response(__return_storage_ptr__,&local_90,&local_b0,&local_d0,
                       (CookieJar *)json_data.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    _Var11._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    post_data._M_dataplus._M_p = (pointer)&post_data.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&post_data,"");
    __h = &headers->_M_h;
    if (*(long *)(json_data._M_dataplus._M_p + 8) == 0) {
      plVar7 = *(long **)(json_data._M_string_length + 0x10);
      if (plVar7 != (long *)0x0) {
        iVar12 = 0;
        do {
          bVar13 = iVar12 != 0;
          iVar12 = iVar12 + -1;
          if (bVar13) {
            std::__cxx11::string::append((char *)&post_data);
          }
          std::operator+(&local_1f8,&post_data,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar7 + 1));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar9) {
            __str.field_2._M_allocated_capacity = *psVar9;
            __str.field_2._8_8_ = plVar6[3];
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar9;
            __str._M_dataplus._M_p = (pointer)*plVar6;
          }
          __str._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&__str,plVar7[5]);
          psVar9 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar9) {
            sendmsg.field_2._M_allocated_capacity = *psVar9;
            sendmsg.field_2._8_8_ = plVar6[3];
            sendmsg._M_dataplus._M_p = (pointer)&sendmsg.field_2;
          }
          else {
            sendmsg.field_2._M_allocated_capacity = *psVar9;
            sendmsg._M_dataplus._M_p = (pointer)*plVar6;
          }
          sendmsg._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::operator=((string *)&post_data,(string *)&sendmsg);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sendmsg._M_dataplus._M_p != &sendmsg.field_2) {
            operator_delete(sendmsg._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
          plVar7 = (long *)*plVar7;
        } while (plVar7 != (long *)0x0);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&post_data);
    }
    p_Var4 = __h;
    __val = -(uint)post_data._M_string_length;
    if (0 < (int)(uint)post_data._M_string_length) {
      __val = (uint)post_data._M_string_length;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar8 = (uint)uVar10;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_0010c7fc;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_0010c7fc;
        }
        if (uVar8 < 10000) goto LAB_0010c7fc;
        uVar10 = uVar10 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_0010c7fc:
    paVar1 = &__str.field_2;
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct
              ((ulong)&__str,(char)__len - (char)((int)(uint)post_data._M_string_length >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p + ((uint)post_data._M_string_length >> 0x1f),__len,__val);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&sendmsg,(char (*) [15])"Content-Length",&__str);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)p_Var4,&sendmsg);
    if (local_220._M_p != local_210) {
      operator_delete(local_220._M_p);
    }
    paVar2 = &sendmsg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sendmsg._M_dataplus._M_p != paVar2) {
      operator_delete(sendmsg._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_const_char_(&)[34],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&sendmsg,(char (*) [13])"Content-Type",
               (char (*) [34])"application/x-www-form-urlencoded");
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)p_Var4,&sendmsg);
    if (local_220._M_p != local_210) {
      operator_delete(local_220._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sendmsg._M_dataplus._M_p != paVar2) {
      operator_delete(sendmsg._M_dataplus._M_p);
    }
    std::operator+(&local_70,"POST ",uri);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar6 = plVar7 + 2;
    if ((long *)*plVar7 == plVar6) {
      local_1a0 = *plVar6;
      lStack_198 = plVar7[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *plVar6;
      local_1b0 = (long *)*plVar7;
    }
    local_1a8 = plVar7[1];
    *plVar7 = (long)plVar6;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_1f8.field_2._M_allocated_capacity = *psVar9;
      local_1f8.field_2._8_8_ = plVar7[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar9;
      local_1f8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1f8,(ulong)(host->_M_dataplus)._M_p);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      __str.field_2._M_allocated_capacity = *psVar9;
      __str.field_2._8_8_ = plVar7[3];
      __str._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      __str.field_2._M_allocated_capacity = *psVar9;
      __str._M_dataplus._M_p = (pointer)*plVar7;
    }
    __str._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&__str);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      sendmsg.field_2._M_allocated_capacity = *psVar9;
      sendmsg.field_2._8_8_ = plVar7[3];
      sendmsg._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      sendmsg.field_2._M_allocated_capacity = *psVar9;
      sendmsg._M_dataplus._M_p = (pointer)*plVar7;
    }
    sendmsg._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,sendmsg._M_dataplus._M_p,
               sendmsg._M_dataplus._M_p + sendmsg._M_string_length);
    pcVar3 = (host->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + host->_M_string_length);
    this_00 = (requests *)(uri->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,this_00,this_00 + uri->_M_string_length);
    make_header(&__str,this_00,&local_f0,&local_110,&local_130,
                (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)__h,(CookieJar *)json_data.field_2._M_allocated_capacity);
    std::__cxx11::string::operator=((string *)&sendmsg,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_append((char *)&sendmsg,(ulong)post_data._M_dataplus._M_p);
    pcVar3 = (host->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar3,pcVar3 + host->_M_string_length);
    pcVar3 = (uri->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar3,pcVar3 + uri->_M_string_length);
    _Var11 = sendmsg._M_dataplus;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,sendmsg._M_dataplus._M_p,
               sendmsg._M_dataplus._M_p + sendmsg._M_string_length);
    request_and_recv(__return_storage_ptr__,(requests *)_Var11._M_p,&local_150,&local_170,sockfd,
                     &local_190,(CookieJar *)json_data.field_2._M_allocated_capacity,
                     json_data.field_2._8_4_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    close(sockfd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sendmsg._M_dataplus._M_p != paVar2) {
      operator_delete(sendmsg._M_dataplus._M_p);
    }
    _Var11._M_p = post_data._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)post_data._M_dataplus._M_p == &post_data.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var11._M_p);
  return __return_storage_ptr__;
}

Assistant:

response requests::post(std::string host,std::string uri,uint16_t port,
				std::unordered_map<std::string,std::string> headers,
				std::string json_data,
				std::unordered_map<std::string,std::string> data,
				CookieJar *cookie,
				int timeout){
		int sockfd;
		if((sockfd=init(host,port))<0)
			return response(host,uri,"",cookie);;

		std::string post_data="";
		if(json_data.size()!=0)
			post_data=json_data;
		else{
			int data_count=0;
			for(auto data_iter=data.begin();data_iter!=data.end();++data_iter){
				if(data_count>0)
					post_data+="&";
				post_data=post_data+data_iter->first+"="+data_iter->second;
				data_count++;
			}
		}

		int data_size=post_data.size();
		headers.insert({"Content-Length",std::to_string(data_size)});
		headers.insert({"Content-Type","application/x-www-form-urlencoded"});

		//base header
		std::string sendmsg=
				"POST "+uri+" HTTP/1.1\r\n"+
				"Host: "+ host+"\r\n";

		sendmsg=make_header(sendmsg,host,uri,headers,cookie);
		sendmsg+=post_data;

		response res=this->request_and_recv(host,uri,sockfd,sendmsg,cookie,timeout);
		close(sockfd);

		return res;
	}